

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgi_api.cpp
# Opt level: O0

void __thiscall
cppcms::impl::cgi::connection::reader::operator()(reader *this,error_code *e,size_t read)

{
  undefined8 uVar1;
  bool bVar2;
  UI_STRING *in_RDX;
  UI_STRING *uis;
  error_code *in_RSI;
  UI *ui;
  UI *in_RDI;
  error_code *in_stack_ffffffffffffff70;
  long *plVar3;
  unsigned_long in_stack_ffffffffffffff80;
  error_code *in_stack_ffffffffffffff88;
  reader *in_stack_ffffffffffffffb8;
  callback<void_(const_std::error_code_&,_unsigned_long)> *in_stack_ffffffffffffffc0;
  undefined1 local_30 [24];
  UI_STRING *local_18;
  
  local_18 = in_RDX;
  bVar2 = std::error_code::operator_cast_to_bool(in_RSI);
  if (bVar2) {
    booster::callback<void_(const_std::error_code_&,_unsigned_long)>::operator()
              ((callback<void_(const_std::error_code_&,_unsigned_long)> *)in_RDI,
               in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  }
  else {
    *(long *)(in_RDI + 8) = *(long *)(in_RDI + 8) - (long)local_18;
    *(UI_STRING **)(in_RDI + 0x18) = local_18 + *(long *)(in_RDI + 0x18);
    *(UI_STRING **)(in_RDI + 0x10) = local_18 + *(long *)(in_RDI + 0x10);
    if (*(long *)(in_RDI + 8) == 0) {
      std::error_code::error_code(in_stack_ffffffffffffff70);
      booster::callback<void_(const_std::error_code_&,_unsigned_long)>::operator()
                ((callback<void_(const_std::error_code_&,_unsigned_long)> *)in_RDI,
                 in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    }
    else {
      plVar3 = *(long **)(in_RDI + 0x20);
      uVar1 = *(undefined8 *)(in_RDI + 8);
      ui = *(UI **)(in_RDI + 0x18);
      reader((reader *)&stack0xffffffffffffffa8,in_RDI,local_18);
      booster::callback<void_(const_std::error_code_&,_unsigned_long)>::
      callback<cppcms::impl::cgi::connection::reader>
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      (**(code **)(*plVar3 + 0x88))(plVar3,ui,uVar1,local_30);
      booster::callback<void_(const_std::error_code_&,_unsigned_long)>::~callback
                ((callback<void_(const_std::error_code_&,_unsigned_long)> *)0x380d8f);
      ~reader((reader *)&stack0xffffffffffffffa8,ui,uis);
    }
  }
  return;
}

Assistant:

void operator() (booster::system::error_code const &e=booster::system::error_code(),size_t read = 0)
	{
		if(e) {
			h(e,done+read);
			return;
		}
		s-=read;
		p+=read;
		done+=read;
		if(s==0)
			h(booster::system::error_code(),done);
		else
			conn->async_read_some(p,s,*this);
	}